

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Object * __thiscall
ICM::Interpreter::CheckCall
          (Interpreter *this,
          vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *Data)

{
  byte bVar1;
  uint8_t uVar2;
  Element *element;
  Object *this_00;
  byte bVar3;
  FuncTableUnit *ftup;
  ObjectPtr op;
  DataList dl;
  FuncTableUnit *local_50;
  Object *local_48;
  string local_40;
  
  element = (Data->
            super__Vector_base<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = (element->field_0).field_0.etype;
  uVar2 = (element->field_0).field_0.stype;
  bVar3 = bVar1 ^ 3;
  if (uVar2 == '\x02' && bVar3 == 0) {
    local_50 = getStFunc(element);
  }
  else {
    if ((bVar1 != 2) && (bVar3 != 0 || uVar2 != '\x04')) {
      printf("%s","Error in CheckCall.");
      putchar(10);
      return (Object *)0x0;
    }
    this_00 = getObject(this,element);
    if (this_00->type == 0xb) {
      local_50 = (FuncTableUnit *)(*this_00->data * 0x78 + GlobalFunctionTable._8_8_);
    }
    else if (this_00->type != 0x12) {
      Object::to_string_abi_cxx11_(&local_40,this_00);
      putchar(0x27);
      printf("%s",local_40._M_dataplus._M_p);
      printf("%s","\' is not Function.");
      putchar(10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,
                        (ulong)(local_40.field_2._M_allocated_capacity + 1));
      }
      return (Object *)0x0;
    }
  }
  createDispCallList((DataList *)&local_40,this,Data,&local_50);
  checkCall((ICM *)&local_48,local_50,(DataList *)&local_40);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_40.field_2._M_allocated_capacity);
  }
  return local_48;
}

Assistant:

Object* CheckCall(vector<Instruction::Element> &Data) {
			const FuncTableUnit *ftup;

			Instruction::Element &front = Data.front();
			if (front.isIdentType(I_StFunc)) {
				ftup = &getStFunc(front);
			}
			else if (front.isIdentType(I_DyVarb) || front.isRefer()) {
				Object *fp = getObject(front);
				if (fp->type == T_Disperse) {
				}
				else if (fp->type != T_Function) {
					println("'", fp->to_string(), "' is not Function.");
					return nullptr;
				}
				else {
					ftup = &fp->dat<T_Function>().getData();
				}
			}
			else {
				println("Error in CheckCall.");
				return nullptr;
			}

			DataList dl = createDispCallList(Data, ftup);
			ObjectPtr op = checkCall(*ftup, dl);
			return op.get();
		}